

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O2

bool gl4cts::TextureViewUtilities::isInternalformatSupported
               (GLenum internalformat,GLint major_version,GLint minor_version)

{
  int iVar1;
  TestError *this;
  uint uVar2;
  
  iVar1 = 0;
  if (internalformat - 0x8229 < 0x14) goto LAB_00aa51c6;
  uVar2 = internalformat - 0x8d62;
  if (uVar2 < 0x2e) {
    if ((0x30c30c30c000U >> ((ulong)uVar2 & 0x3f) & 1) != 0) goto LAB_00aa51c6;
    if ((ulong)uVar2 != 0) goto LAB_00aa509a;
  }
  else {
LAB_00aa509a:
    if (internalformat - 0x9270 < 10) {
      iVar1 = 3;
      goto LAB_00aa51c6;
    }
    if ((((internalformat - 0x8f94 < 8) ||
         ((internalformat - 0x8051 < 0xb && ((0x5e9U >> (internalformat - 0x8051 & 0x1f) & 1) != 0))
         )) || ((internalformat - 0x8814 < 8 &&
                ((0xc3U >> (internalformat - 0x8814 & 0x1f) & 1) != 0)))) ||
       (((internalformat - 0x8c3a < 10 && ((0x289U >> (internalformat - 0x8c3a & 0x1f) & 1) != 0))
        || (internalformat - 0x8dbb < 4)))) goto LAB_00aa51c6;
    if (3 < internalformat - 0x8e8c) {
      if (((1 < internalformat - 0x81a5) && (1 < internalformat - 0x8cac)) &&
         ((internalformat != 0x88f0 && (internalformat != 0x906f)))) {
        this = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this,"Unrecognized internalformat",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                   ,0x9ef);
        __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      goto LAB_00aa51c6;
    }
  }
  iVar1 = 2;
LAB_00aa51c6:
  return iVar1 <= minor_version;
}

Assistant:

bool TextureViewUtilities::isInternalformatSupported(glw::GLenum internalformat, const glw::GLint major_version,
													 const glw::GLint minor_version)
{
	(void)major_version;
	/* NOTE: This function, as it stands right now, does not consider OpenGL contexts
	 *       lesser than 4.
	 **/
	glw::GLint minimum_minor_version = 0;

	DE_ASSERT(major_version >= 4);

	switch (internalformat)
	{
	/* >= OpenGL 4.0 */
	case GL_RGBA32F:
	case GL_RGBA32I:
	case GL_RGBA32UI:
	case GL_RGBA16:
	case GL_RGBA16F:
	case GL_RGBA16I:
	case GL_RGBA16UI:
	case GL_RGBA8:
	case GL_RGBA8I:
	case GL_RGBA8UI:
	case GL_SRGB8_ALPHA8:
	case GL_RGB10_A2:
	case GL_RGB10_A2UI:
	case GL_RGB5_A1:
	case GL_RGBA4:
	case GL_R11F_G11F_B10F:
	case GL_RG32F:
	case GL_RG32I:
	case GL_RG32UI:
	case GL_RG16:
	case GL_RG16F:
	case GL_RG16I:
	case GL_RG16UI:
	case GL_RG8:
	case GL_RG8I:
	case GL_RG8UI:
	case GL_R32F:
	case GL_R32I:
	case GL_R32UI:
	case GL_R16F:
	case GL_R16I:
	case GL_R16UI:
	case GL_R16:
	case GL_R8:
	case GL_R8I:
	case GL_R8UI:
	case GL_RGBA16_SNORM:
	case GL_RGBA8_SNORM:
	case GL_RGB32F:
	case GL_RGB32I:
	case GL_RGB32UI:
	case GL_RGB16_SNORM:
	case GL_RGB16F:
	case GL_RGB16I:
	case GL_RGB16UI:
	case GL_RGB16:
	case GL_RGB8_SNORM:
	case GL_RGB8:
	case GL_RGB8I:
	case GL_RGB8UI:
	case GL_SRGB8:
	case GL_RGB9_E5:
	case GL_RG16_SNORM:
	case GL_RG8_SNORM:
	case GL_R16_SNORM:
	case GL_R8_SNORM:
	case GL_DEPTH_COMPONENT32F:
	case GL_DEPTH_COMPONENT24:
	case GL_DEPTH_COMPONENT16:
	case GL_DEPTH32F_STENCIL8:
	case GL_DEPTH24_STENCIL8:
	case GL_COMPRESSED_RED_RGTC1:
	case GL_COMPRESSED_SIGNED_RED_RGTC1:
	case GL_COMPRESSED_RG_RGTC2:
	case GL_COMPRESSED_SIGNED_RG_RGTC2:
	{
		/* Already covered by default value of minimum_minor_version */

		break;
	}

	/* >= OpenGL 4.2 */
	case GL_RGB565:
	case GL_COMPRESSED_RGBA_BPTC_UNORM:
	case GL_COMPRESSED_SRGB_ALPHA_BPTC_UNORM:
	case GL_COMPRESSED_RGB_BPTC_SIGNED_FLOAT:
	case GL_COMPRESSED_RGB_BPTC_UNSIGNED_FLOAT:
	{
		minimum_minor_version = 2;

		break;
	}

	/* >= OpenGL 4.3 */
	case GL_COMPRESSED_RGB8_ETC2:
	case GL_COMPRESSED_SRGB8_ETC2:
	case GL_COMPRESSED_RGB8_PUNCHTHROUGH_ALPHA1_ETC2:
	case GL_COMPRESSED_SRGB8_PUNCHTHROUGH_ALPHA1_ETC2:
	case GL_COMPRESSED_RGBA8_ETC2_EAC:
	case GL_COMPRESSED_SRGB8_ALPHA8_ETC2_EAC:
	case GL_COMPRESSED_R11_EAC:
	case GL_COMPRESSED_SIGNED_R11_EAC:
	case GL_COMPRESSED_RG11_EAC:
	case GL_COMPRESSED_SIGNED_RG11_EAC:
	{
		minimum_minor_version = 3;

		break;
	}

	default:
		TCU_FAIL("Unrecognized internalformat");
	}

	return (minor_version >= minimum_minor_version);
}